

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.h
# Opt level: O0

void __thiscall
ezy::detail::
iterator_filter<ezy::detail::iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>,_ezy::piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>_>
::iterator_filter(iterator_filter<ezy::detail::iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>,_ezy::piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>_>
                  *this,iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
                        *original,piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)> *p,
                 iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
                 *end)

{
  bool bVar1;
  byte local_65;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
  *local_28;
  iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
  *end_local;
  piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)> *p_local;
  iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
  *original_local;
  iterator_filter<ezy::detail::iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>,_ezy::piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>_>
  *this_local;
  
  *(undefined8 *)
   &(this->orig).storage.
    super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    .
    super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
    .
    super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
    ._M_head_impl.iters =
       (original->storage).
       super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
       .
       super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
       .
       super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
       ._M_head_impl.iters.
       super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
       .
       super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  ;
  (((_Head_base<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
     *)((long)&(this->orig).storage.
               super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
               .
               super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
               ._M_head_impl.iters + 8))->_M_head_impl)._M_current =
       (((_Head_base<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
          *)((long)&(original->storage).
                    super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    .
                    super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    .
                    super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
                    ._M_head_impl.iters.
                    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
            + 8))->_M_head_impl)._M_current;
  (this->end_iterator).storage.
  super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
  ._M_head_impl.iters.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
       = (end->storage).
         super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
         .
         super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
         .
         super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
         ._M_head_impl.iters.
         super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
         .
         super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  ;
  (((_Head_base<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
     *)((long)&(this->end_iterator).storage.
               super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
               .
               super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
               .
               super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
               ._M_head_impl.iters + 8))->_M_head_impl)._M_current =
       (((_Head_base<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
          *)((long)&(end->storage).
                    super__Tuple_impl<0UL,_ezy::make_tuple_fn,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    .
                    super__Tuple_impl<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
                    .
                    super__Head_base<1UL,_ezy::detail::iterator_tracker<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>,_false>
                    ._M_head_impl.iters.
                    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
            + 8))->_M_head_impl)._M_current;
  (this->predicate).fs.super__Tuple_impl<0UL,_const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>.
  super__Tuple_impl<1UL,_bool_(&)(int)>.super__Head_base<1UL,_bool_(&)(int),_false>._M_head_impl =
       (p->fs).super__Tuple_impl<0UL,_const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>.
       super__Tuple_impl<1UL,_bool_(&)(int)>.super__Head_base<1UL,_bool_(&)(int),_false>.
       _M_head_impl;
  (this->predicate).fs.super__Tuple_impl<0UL,_const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>.
  super__Head_base<0UL,_const_ezy::pick_nth_t<1UL>_&,_false>._M_head_impl =
       (p->fs).super__Tuple_impl<0UL,_const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)>.
       super__Head_base<0UL,_const_ezy::pick_nth_t<1UL>_&,_false>._M_head_impl;
  local_28 = end;
  end_local = (iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
               *)p;
  p_local = (piped<const_ezy::pick_nth_t<1UL>_&,_bool_(&)(int)> *)original;
  original_local = &this->orig;
  bVar1 = iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
          ::operator!=(&this->orig,&this->end_iterator);
  local_65 = 0;
  if (bVar1) {
    iterator_zipper<ezy::make_tuple_fn,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_const_ezy::strong_type<std::vector<int,_std::allocator<int>_>,_PointsTag,_ezy::features::iterable>_>
    ::operator*(&local_50,&this->orig);
    bVar1 = piped<ezy::pick_nth_t<1ul>const&,bool(&)(int)>::operator()
                      ((piped<ezy::pick_nth_t<1ul>const&,bool(&)(int)> *)&this->predicate,&local_50)
    ;
    local_65 = bVar1 ^ 0xff;
    std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~tuple(&local_50);
  }
  if ((local_65 & 1) != 0) {
    operator++(this);
  }
  return;
}

Assistant:

iterator_filter(orig_type original, const predicate_type& p, const orig_type& end)
        : orig(original)
        , end_iterator(end)
        , predicate(p)
      {
        if (orig != end_iterator && !predicate(*orig))
          operator++();
      }